

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CallOnce.h
# Opt level: O1

void axl::sl::
     callOnce<axl::sl::ConstructSimpleSingleton<axl::sl::PackerImpl<axl::sl::PackPtrSize>>,unsigned_char*>
               (undefined8 *param_1,int *param_2)

{
  int iVar1;
  int32_t *piVar2;
  
  piVar2 = &callOnce<axl::sl::ConstructSimpleSingleton<axl::sl::PackerImpl<axl::sl::PackPtrSize>_>,_unsigned_char_*>
            ::defaultFlag;
  if (param_2 != (int *)0x0) {
    piVar2 = param_2;
  }
  if (*piVar2 != 2) {
    if (*piVar2 == 0) {
      LOCK();
      iVar1 = *piVar2;
      if (iVar1 == 0) {
        *piVar2 = 1;
      }
      UNLOCK();
      if (iVar1 == 0) {
        *param_1 = &PTR_pack_va_0014cc98;
        LOCK();
        *piVar2 = 2;
        UNLOCK();
        return;
      }
    }
    do {
      sched_yield();
    } while (*piVar2 != 2);
  }
  return;
}

Assistant:

void
callOnce(
	Functor functor,
	Argument argument,
	volatile int32_t* flag = NULL
) {
	enum OnceFlag {
		OnceFlag_Uninitialized = 0,
		OnceFlag_Initializing  = 1,
		OnceFlag_Initialized   = 2,
	};

	static volatile int32_t defaultFlag = 0;
	if (!flag)
		flag = &defaultFlag;

	int32_t value = *flag;
	if (value == OnceFlag_Initialized)
		return;

	if (value == OnceFlag_Uninitialized && // try to save one interlocked cmpxcg
		sys::atomicCmpXchg(flag, OnceFlag_Uninitialized, OnceFlag_Initializing) == OnceFlag_Uninitialized) {
		functor(argument);
		sys::atomicXchg(flag, OnceFlag_Initialized);
	} else do {
		sys::yieldProcessor();
	} while (*flag != OnceFlag_Initialized);
}